

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

RegExp * re2c::repeat_from_to(RegExp *e,uint32_t n,uint32_t m)

{
  re2c *this;
  re2c *this_00;
  RegExp *pRVar1;
  RegExp *e1;
  undefined4 in_register_00000014;
  RegExp *extraout_RDX;
  RegExp *e2;
  RegExp *extraout_RDX_00;
  int iVar2;
  uint32_t uVar3;
  pair<std::_Rb_tree_iterator<re2c::RegExp_*>,_bool> pVar4;
  re2c *local_38;
  
  pRVar1 = (RegExp *)CONCAT44(in_register_00000014,m);
  this = (re2c *)0x0;
  uVar3 = n;
  if (n != 0) {
    do {
      this = (re2c *)doCat(this,e,pRVar1);
      uVar3 = uVar3 - 1;
      pRVar1 = extraout_RDX;
    } while (uVar3 != 0);
  }
  e1 = (RegExp *)0x0;
  iVar2 = m - n;
  if (n <= m && iVar2 != 0) {
    do {
      this_00 = (re2c *)operator_new(8);
      *(undefined ***)this_00 = &PTR__RegExp_0015bd10;
      local_38 = this_00;
      pVar4 = std::
              _Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
              ::_M_insert_unique<re2c::RegExp*>
                        ((_Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
                          *)RegExp::vFreeList,(RegExp **)&local_38);
      *(undefined ***)this_00 = &PTR__RegExp_0015bc50;
      pRVar1 = doCat((re2c *)e,e1,pVar4._8_8_);
      e1 = mkAlt(this_00,pRVar1,e2);
      iVar2 = iVar2 + -1;
      pRVar1 = extraout_RDX_00;
    } while (iVar2 != 0);
  }
  pRVar1 = doCat(this,e1,pRVar1);
  return pRVar1;
}

Assistant:

RegExp * repeat_from_to (RegExp * e, uint32_t n, uint32_t m)
{
	RegExp * r1 = repeat (e, n);
	RegExp * r2 = NULL;
	for (uint32_t i = n; i < m; ++i)
	{
		r2 = mkAlt (new NullOp, doCat (e, r2));
	}
	return doCat (r1, r2);
}